

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_log.c
# Opt level: O0

void ap_log(AP_LOG_LEVEL level,char *format,...)

{
  char in_AL;
  tm *__tp;
  size_t sVar1;
  char *src;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  size_t local_60;
  size_t log_buf_len;
  va_list args;
  size_t log_buf_size;
  size_t size;
  tm *tm;
  time_t t;
  char *format_local;
  AP_LOG_LEVEL level_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_60 = 0;
  if ((format != (char *)0x0) && (level <= ap_log_level)) {
    local_108 = in_RDX;
    local_100 = in_RCX;
    local_f8 = in_R8;
    local_f0 = in_R9;
    t = (time_t)format;
    format_local._4_4_ = level;
    tm = (tm *)time((time_t *)0x0);
    if ((tm != (tm *)0xffffffffffffffff) &&
       ((__tp = localtime((time_t *)&tm), __tp != (tm *)0x0 &&
        (sVar1 = strftime(ap_log_buf,0x1000,"%Y/%m/%d %H:%M:%S",__tp), sVar1 == 0)))) {
      ap_str_strlcpy(ap_log_buf,"strftime error",0x1000);
    }
    ap_str_strlcat(ap_log_buf," [",0x1000);
    src = level_to_str(format_local._4_4_);
    ap_str_strlcat(ap_log_buf,src,0x1000);
    ap_str_strlcat(ap_log_buf,"] ",0x1000);
    args[0].overflow_arg_area = local_118;
    args[0]._0_8_ = &stack0x00000008;
    log_buf_len._4_4_ = 0x30;
    log_buf_len._0_4_ = 0x10;
    local_60 = strlen(ap_log_buf);
    vsnprintf(ap_log_buf + local_60,0x1000 - local_60,(char *)t,&log_buf_len);
    fprintf((FILE *)ap_log_file,"%s",ap_log_buf);
    fflush((FILE *)ap_log_file);
  }
  return;
}

Assistant:

void ap_log (AP_LOG_LEVEL level, const char *format, ...)
{
	time_t		t;
	struct tm	*tm					= NULL;
	size_t		size;
	size_t		log_buf_size		= sizeof (ap_log_buf);
	va_list		args;
	size_t		log_buf_len			= 0;

	if (format == NULL)
	{
		goto finish;
	}

	if (level > ap_log_level)
	{
		goto finish;
	}

	t = time (NULL);
	if (t != (time_t) -1)
	{
		tm = localtime (&t);
		if (tm != NULL)
		{
			size = strftime (ap_log_buf, log_buf_size, AP_LOG_TIME_FORMAT, tm);
			if (size == 0)
			{
				ap_str_strlcpy (ap_log_buf, "strftime error", log_buf_size);
			}
		}
	}

	ap_str_strlcat (ap_log_buf, " [", log_buf_size);
	ap_str_strlcat (ap_log_buf, level_to_str (level), log_buf_size);
	ap_str_strlcat (ap_log_buf, "] ", log_buf_size);

	va_start (args, format);

	log_buf_len = strlen (ap_log_buf);
	vsnprintf (ap_log_buf + log_buf_len, log_buf_size - log_buf_len, format, args);

	va_end (args);

	fprintf (ap_log_file, "%s", ap_log_buf);

	fflush (ap_log_file);

finish:
	return;
}